

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * __thiscall
pbrt::GoniometricLight::Bounds(LightBounds *__return_storage_ptr__,GoniometricLight *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  bool bVar8;
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [64];
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  Point3<float> PVar14;
  float local_ac;
  Tuple3<pbrt::Point3,_float> local_70;
  undefined1 local_60 [48];
  undefined1 extraout_var [60];
  
  TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  TVar7.x = 0;
  TVar7.y = 0;
  uVar2 = TVar6.x;
  uVar3 = TVar6.y;
  local_ac = 0.0;
  for (uVar5 = 0; uVar5 != (~((int)uVar3 >> 0x1f) & uVar3); uVar5 = uVar5 + 1) {
    fVar9 = sinf((((float)(int)uVar5 + 0.5) * 3.1415927) / (float)(int)uVar3);
    uVar4 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
    TVar6 = TVar7;
    while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
      Image::GetChannels((ImageChannelValues *)local_60,&this->image,(Point2i)TVar6,
                         (array<pbrt::WrapMode,_2>)
                         *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
      auVar11._0_4_ = ImageChannelValues::MaxValue((ImageChannelValues *)local_60);
      auVar11._4_60_ = extraout_var;
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_ac),auVar11._0_16_,ZEXT416((uint)fVar9));
      local_ac = auVar1._0_4_;
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_60);
      TVar6 = (Tuple2<pbrt::Point2,_int>)((long)TVar6 + 1);
    }
    TVar7 = (Tuple2<pbrt::Point2,_int>)((long)TVar7 + 0x100000000);
  }
  fVar9 = this->scale;
  FVar10 = DenselySampledSpectrum::MaxValue(&this->I);
  fVar9 = FVar10 * fVar9;
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 0.0;
  auVar13 = ZEXT856(0);
  PVar14 = Transform::operator()
                     (&(this->super_LightBase).renderFromLight,(Point3<float> *)&local_70);
  local_60._8_4_ = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar12._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar13;
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_70.z = 1.0;
  local_60._0_8_ = vmovlps_avx(auVar12._0_16_);
  LightBounds::LightBounds
            (__return_storage_ptr__,(Point3f *)local_60,(Vector3f *)&local_70,
             ((fVar9 + fVar9) * 3.1415927 * 3.1415927 * local_ac) / (float)(int)(uVar3 * uVar2),
             3.1415927,1.5707964,false);
  return __return_storage_ptr__;
}

Assistant:

LightBounds GoniometricLight::Bounds() const {
    // Like Phi() method, but compute the weighted max component value of
    // the image map.
    Float weightedMaxImageSum = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            weightedMaxImageSum +=
                sinTheta * image.GetChannels({u, v}, wrapMode).MaxValue();
    }
    Float phi =
        scale * I.MaxValue() * 2 * Pi * Pi * weightedMaxImageSum / (width * height);

    Point3f p = renderFromLight(Point3f(0, 0, 0));
    // Bound it as an isotropic point light.
    return LightBounds(p, Vector3f(0, 0, 1), phi, Pi, Pi / 2, false);
}